

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_language_server.cpp
# Opt level: O3

void __thiscall
cmakels::cmake_language_server::didChange
          (cmake_language_server *this,DidChangeTextDocumentParams *params)

{
  _Optional_payload_base<cmListFile> *this_00;
  _Optional_payload_base<cmListFile> local_50;
  
  cmakels::parser::parse_listfile
            ((optional<cmListFile> *)&local_50,
             &((params->contentChanges).
               super__Vector_base<lscpp::protocol::TextDocumentContentChangeEvent,_std::allocator<lscpp::protocol::TextDocumentContentChangeEvent>_>
               ._M_impl.super__Vector_impl_data._M_start)->text);
  this_00 = (_Optional_payload_base<cmListFile> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmListFile>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmListFile>_>_>_>
            ::operator[](&this->open_files_,(key_type *)params);
  std::_Optional_payload_base<cmListFile>::_M_move_assign(this_00,&local_50);
  if (local_50._M_engaged == true) {
    std::_Optional_payload_base<cmListFile>::_M_destroy(&local_50);
  }
  return;
}

Assistant:

void cmake_language_server::didChange(
    protocol::DidChangeTextDocumentParams params) {
  open_files_[params.textDocument.uri] =
      parser::parse_listfile(params.contentChanges[0].text); // using full sync
  // TODO don't parse everytime: probably save the string and keep a cache
  // and keep a cache for parsed file
}